

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Purpose>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Purpose> *this,
          TypedAttributeWithFallback<tinyusdz::Purpose> *param_1)

{
  bool bVar1;
  pointer pPVar2;
  undefined3 uVar3;
  Purpose PVar4;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  pPVar2 = (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = (param_1->_attrib).has_value_;
  (this->_attrib).has_value_ = bVar1;
  if (bVar1 == true) {
    (this->_attrib).contained = (param_1->_attrib).contained;
  }
  this->_blocked = param_1->_blocked;
  uVar3 = *(undefined3 *)&param_1->field_0x229;
  PVar4 = param_1->_fallback;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x229 = uVar3;
  this->_fallback = PVar4;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }